

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O0

Matrix<float,_2,_2> __thiscall
tcu::operator*(tcu *this,Matrix<float,_2,_3> *a,Matrix<float,_3,_2> *b)

{
  float fVar1;
  float *pfVar2;
  float extraout_XMM0_Qa [2];
  Vector<float,_2> VVar3;
  Vector<float,_2> in_XMM1_Qa;
  Matrix<float,_2,_2> MVar4;
  undefined4 local_34;
  undefined4 local_30;
  int ndx;
  float v;
  int col;
  int row;
  Matrix<float,_3,_2> *b_local;
  Matrix<float,_2,_3> *a_local;
  Matrix<float,_2,_2> *res;
  
  Matrix<float,_2,_2>::Matrix((Matrix<float,_2,_2> *)this);
  VVar3.m_data = extraout_XMM0_Qa;
  for (v = 0.0; (int)v < 2; v = (float)((int)v + 1)) {
    for (ndx = 0; ndx < 2; ndx = ndx + 1) {
      local_30 = 0.0;
      for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
        pfVar2 = Matrix<float,_2,_3>::operator()(a,(int)v,local_34);
        fVar1 = *pfVar2;
        pfVar2 = Matrix<float,_3,_2>::operator()(b,local_34,ndx);
        in_XMM1_Qa.m_data[1] = 0.0;
        in_XMM1_Qa.m_data[0] = local_30;
        local_30 = fVar1 * *pfVar2 + local_30;
      }
      pfVar2 = Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)this,(int)v,ndx);
      VVar3.m_data[1] = 0.0;
      VVar3.m_data[0] = local_30;
      *pfVar2 = local_30;
    }
  }
  MVar4.m_data.m_data[1].m_data[0] = in_XMM1_Qa.m_data[0];
  MVar4.m_data.m_data[1].m_data[1] = in_XMM1_Qa.m_data[1];
  MVar4.m_data.m_data[0].m_data[0] = VVar3.m_data[0];
  MVar4.m_data.m_data[0].m_data[1] = VVar3.m_data[1];
  return (Matrix<float,_2,_2>)MVar4.m_data.m_data;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}